

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
chatra::emb::containers::ContainersPackageInterface::saveNativePtr
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ContainersPackageInterface *this,PackageContext *pct,INativePtr *ptr)

{
  ByteArrayData *self;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writeRawInt(__return_storage_ptr__,(long)*(int *)&ptr[1]._vptr_INativePtr);
  if (*(int *)&ptr[1]._vptr_INativePtr == 0) {
    writeRawInt(__return_storage_ptr__,(long)ptr[4]._vptr_INativePtr - (long)ptr[3]._vptr_INativePtr
               );
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (__return_storage_ptr__,
               (long)((__return_storage_ptr__->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_finish + (long)ptr[4]._vptr_INativePtr) -
               (long)((__return_storage_ptr__->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start + (long)ptr[3]._vptr_INativePtr));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,ptr[3]._vptr_INativePtr,ptr[4]._vptr_INativePtr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> saveNativePtr(PackageContext& pct, INativePtr* ptr) override {
		(void)pct;
		std::vector<uint8_t> buffer;

		auto* data = static_cast<NativeData*>(ptr);
		writeInt(buffer, static_cast<uint64_t>(data->type));

		switch (data->type) {
		case Type::ByteArray: {
			auto* self = static_cast<ByteArrayData*>(ptr);
			writeInt(buffer, self->data.size());
			buffer.reserve(buffer.size() + self->data.size());
			buffer.insert(buffer.cend(), self->data.cbegin(), self->data.cend());
			break;
		}
		}
		return buffer;
	}